

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_add_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  int32_t iVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  int start;
  uint uVar5;
  uint uVar6;
  
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  for (start = 0; start != 0x20; start = start + 8) {
    iVar1 = sextract32(r1,start,8);
    iVar2 = sextract32(r2,start,8);
    uVar3 = iVar2 + iVar1;
    uVar6 = uVar6 | (int)(char)uVar3 != uVar3;
    uVar5 = uVar5 | uVar3 * 2 ^ uVar3;
    uVar4 = uVar4 | (uVar3 & 0xff) << ((byte)start & 0x1f);
  }
  env->PSW_USB_V = uVar6 << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar6 << 0x1f;
  env->PSW_USB_AV = uVar5 << 0x18;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar5 << 0x18;
  return uVar4;
}

Assistant:

uint32_t helper_add_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r1, extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    uint32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r1 = sextract32(r1, i * 8, 8);
        extr_r2 = sextract32(r2, i * 8, 8);

        b = extr_r1 + extr_r2;
        ovf |= ((b > 0x7f) || (b < -0x80));
        avf |= b ^ b * 2u;
        ret |= ((b & 0xff) << (i*8));
    }

    env->PSW_USB_V = (ovf << 31);
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}